

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

int CalcDamageValue(VMFunction *func)

{
  VMOP *pVVar1;
  VMScriptFunction *pVVar2;
  VMOP *op;
  VMScriptFunction *sfunc;
  VMFunction *func_local;
  
  if (func == (VMFunction *)0x0) {
    func_local._4_4_ = 0;
  }
  else {
    pVVar2 = dyn_cast<VMScriptFunction>(&func->super_DObject);
    if (pVVar2 == (VMScriptFunction *)0x0) {
      func_local._4_4_ = 0x40000000;
    }
    else {
      pVVar1 = pVVar2->Code;
      if (((pVVar1->field_0).op == 'A') && ((pVVar1->field_0).a == '\0')) {
        func_local._4_4_ = (int)pVVar1->word >> 0x10;
      }
      else if (((pVVar1->field_0).op == '@') &&
              (((pVVar1->field_0).a == '\0' && ((pVVar1->field_0).b == '\x04')))) {
        func_local._4_4_ = pVVar2->KonstD[(pVVar1->field_0).c];
      }
      else {
        func_local._4_4_ = 0x40000000;
      }
    }
  }
  return func_local._4_4_;
}

Assistant:

static int CalcDamageValue(VMFunction *func)
{
	if (func == NULL)
	{
		return 0;
	}
	VMScriptFunction *sfunc = dyn_cast<VMScriptFunction>(func);
	if (sfunc == NULL)
	{
		return 0x40000000;
	}
	VMOP *op = sfunc->Code;
	// If the function was created by CreateDamageFunction(), extract
	// the value used to create it and return that. Otherwise, return
	// indicating to use the default function.
	if (op->op == OP_RETI && op->a == 0)
	{
		return op->i16;
	}
	if (op->op == OP_RET && op->a == 0 && op->b == (REGT_INT | REGT_KONST))
	{
		return sfunc->KonstD[op->c];
	}
	return 0x40000000;
}